

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_xar(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t srcidx;
  uint32_t arg2;
  uint32_t srcidx_00;
  uint32_t destidx;
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  int local_5c;
  TCGv_i64 pTStack_58;
  int pass;
  TCGv_i64 tcg_res [2];
  TCGv_i64 tcg_op2;
  TCGv_i64 tcg_op1;
  int rd;
  int rn;
  int imm6;
  int rm;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  srcidx = extract32(insn,0x10,5);
  arg2 = extract32(insn,10,6);
  srcidx_00 = extract32(insn,5,5);
  destidx = extract32(insn,0,5);
  _Var1 = isar_feature_aa64_sha3(s->isar);
  if (_Var1) {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      arg = tcg_temp_new_i64(tcg_ctx_00);
      arg_00 = tcg_temp_new_i64(tcg_ctx_00);
      pTStack_58 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_res[0] = tcg_temp_new_i64(tcg_ctx_00);
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        read_vec_element(s,arg,srcidx_00,local_5c,MO_64);
        read_vec_element(s,arg_00,srcidx,local_5c,MO_64);
        tcg_gen_xor_i64_aarch64
                  (tcg_ctx_00,*(TCGv_i64 *)((long)&stack0xffffffffffffffa8 + (long)local_5c * 8),arg
                   ,arg_00);
        tcg_gen_rotri_i64_aarch64
                  (tcg_ctx_00,*(TCGv_i64 *)((long)&stack0xffffffffffffffa8 + (long)local_5c * 8),
                   *(TCGv_i64 *)((long)&stack0xffffffffffffffa8 + (long)local_5c * 8),arg2);
      }
      write_vec_element(s,pTStack_58,destidx,0,MO_64);
      write_vec_element(s,tcg_res[0],destidx,1,MO_64);
      tcg_temp_free_i64(tcg_ctx_00,arg);
      tcg_temp_free_i64(tcg_ctx_00,arg_00);
      tcg_temp_free_i64(tcg_ctx_00,pTStack_58);
      tcg_temp_free_i64(tcg_ctx_00,tcg_res[0]);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_crypto_xar(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rm = extract32(insn, 16, 5);
    int imm6 = extract32(insn, 10, 6);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
    int pass;

    if (!dc_isar_feature(aa64_sha3, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_op1 = tcg_temp_new_i64(tcg_ctx);
    tcg_op2 = tcg_temp_new_i64(tcg_ctx);
    tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
    tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

    for (pass = 0; pass < 2; pass++) {
        read_vec_element(s, tcg_op1, rn, pass, MO_64);
        read_vec_element(s, tcg_op2, rm, pass, MO_64);

        tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
        tcg_gen_rotri_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], imm6);
    }
    write_vec_element(s, tcg_res[0], rd, 0, MO_64);
    write_vec_element(s, tcg_res[1], rd, 1, MO_64);

    tcg_temp_free_i64(tcg_ctx, tcg_op1);
    tcg_temp_free_i64(tcg_ctx, tcg_op2);
    tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
    tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
}